

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerNewScObjectSimple(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  RegOpnd *newObjDst;
  undefined4 *puVar4;
  Opnd *typeSrc;
  
  newObjDst = (RegOpnd *)IR::Instr::UnlinkDst(instr);
  OVar2 = IR::Opnd::GetKind((Opnd *)newObjDst);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar3 = Js::FunctionBody::DoObjectHeaderInliningForEmptyObjects();
  typeSrc = LoadLibraryValueOpnd(this,instr,bVar3 + ValueObjectType);
  GenerateDynamicObjectAlloc(this,instr,0,0,newObjDst,typeSrc);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void
Lowerer::LowerNewScObjectSimple(IR::Instr * instr)
{
    GenerateDynamicObjectAlloc(
        instr,
        0,
        0,
        instr->UnlinkDst()->AsRegOpnd(),
        LoadLibraryValueOpnd(
            instr,
            Js::FunctionBody::DoObjectHeaderInliningForEmptyObjects()
                ? LibraryValue::ValueObjectHeaderInlinedType
                : LibraryValue::ValueObjectType));
    instr->Remove();
}